

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall CoreML::Specification::CumSumLayerParams::ByteSizeLong(CumSumLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->axis_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = this->axis_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3 + 2;
  if (this->excludefinalsum_ == false) {
    sVar4 = sVar3;
  }
  sVar3 = sVar4 + 2;
  if (this->reverse_ == false) {
    sVar3 = sVar4;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::int64 CumSumLayerParams::axis() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.CumSumLayerParams.axis)
  return axis_;
}